

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::GenerateMembers
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  WrapperFieldGenerator *this_00;
  FieldGeneratorBase *pFVar4;
  Options *pOVar5;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> local_38;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> single_generator_1;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> local_20;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> single_generator;
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  single_generator.ptr_ = (FieldGeneratorBase *)printer;
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n    = "
                    );
  bVar3 = IsWrapperType((this->super_FieldGeneratorBase).descriptor_);
  if (bVar3) {
    this_00 = (WrapperFieldGenerator *)operator_new(0x60);
    pFVar2 = (this->super_FieldGeneratorBase).descriptor_;
    iVar1 = (this->super_FieldGeneratorBase).fieldOrdinal_;
    pOVar5 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    WrapperFieldGenerator::WrapperFieldGenerator(this_00,pFVar2,iVar1,pOVar5);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
              (&local_20,(FieldGeneratorBase *)this_00);
    pFVar4 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&local_20);
    (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])
              (pFVar4,single_generator.ptr_);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
              (&local_20);
  }
  else {
    pFVar4 = (FieldGeneratorBase *)operator_new(0x58);
    pFVar2 = (this->super_FieldGeneratorBase).descriptor_;
    iVar1 = (this->super_FieldGeneratorBase).fieldOrdinal_;
    pOVar5 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    MessageFieldGenerator::MessageFieldGenerator
              ((MessageFieldGenerator *)pFVar4,pFVar2,iVar1,pOVar5);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
              (&local_38,pFVar4);
    pFVar4 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&local_38);
    (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])
              (pFVar4,single_generator.ptr_);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
              (&local_38);
  }
  io::Printer::Print((Printer *)single_generator.ptr_,";\n");
  io::Printer::Print((Printer *)single_generator.ptr_,&(this->super_FieldGeneratorBase).variables_,
                     "private readonly pbc::RepeatedField<$type_name$> $name$_ = new pbc::RepeatedField<$type_name$>();\n"
                    );
  WritePropertyDocComment
            ((Printer *)single_generator.ptr_,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes
            (&this->super_FieldGeneratorBase,(Printer *)single_generator.ptr_);
  io::Printer::Print((Printer *)single_generator.ptr_,&(this->super_FieldGeneratorBase).variables_,
                     "$access_level$ pbc::RepeatedField<$type_name$> $property_name$ {\n  get { return $name$_; }\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::GenerateMembers(io::Printer* printer) {
  printer->Print(
    variables_,
    "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n"
    "    = ");
  // Don't want to duplicate the codec code here... maybe we should have a
  // "create single field generator for this repeated field"
  // function, but it doesn't seem worth it for just this.
  if (IsWrapperType(descriptor_)) {
    scoped_ptr<FieldGeneratorBase> single_generator(
      new WrapperFieldGenerator(descriptor_, fieldOrdinal_, this->options()));
    single_generator->GenerateCodecCode(printer);
  } else {
    scoped_ptr<FieldGeneratorBase> single_generator(
      new MessageFieldGenerator(descriptor_, fieldOrdinal_, this->options()));
    single_generator->GenerateCodecCode(printer);
  }
  printer->Print(";\n");
  printer->Print(
    variables_,
    "private readonly pbc::RepeatedField<$type_name$> $name$_ = new pbc::RepeatedField<$type_name$>();\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ pbc::RepeatedField<$type_name$> $property_name$ {\n"
    "  get { return $name$_; }\n"
    "}\n");
}